

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

void __thiscall PointerType::print(PointerType *this)

{
  char *pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (char *)llvm::outs();
  (*(this->super_Type)._vptr_Type[3])(local_38,this);
  llvm::raw_ostream::write(pcVar1,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void PointerType::print() const {
    llvm::outs() << toString();
}